

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::FunctionDeclarationSyntax::FunctionDeclarationSyntax
          (FunctionDeclarationSyntax *this,SyntaxKind kind,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          FunctionPrototypeSyntax *prototype,Token semi,SyntaxList<slang::syntax::SyntaxNode> *items
          ,Token end,NamedBlockClauseSyntax *endBlockName)

{
  Token TVar1;
  FunctionPrototypeSyntax *pFVar2;
  iterator ppSVar3;
  SyntaxNode *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::SyntaxNode> *__range2;
  FunctionPrototypeSyntax *local_38;
  FunctionPrototypeSyntax *prototype_local;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  FunctionDeclarationSyntax *pFStack_20;
  SyntaxKind kind_local;
  FunctionDeclarationSyntax *this_local;
  Token semi_local;
  
  TVar1 = end;
  semi_local._0_8_ = semi.info;
  this_local = semi._0_8_;
  local_38 = prototype;
  prototype_local = (FunctionPrototypeSyntax *)attributes;
  attributes_local._4_4_ = kind;
  pFStack_20 = this;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,kind,attributes);
  __range2 = (SyntaxList<slang::syntax::SyntaxNode> *)local_38;
  not_null<slang::syntax::FunctionPrototypeSyntax*>::
  not_null<slang::syntax::FunctionPrototypeSyntax*,void>
            ((not_null<slang::syntax::FunctionPrototypeSyntax*> *)&this->prototype,
             (FunctionPrototypeSyntax **)&__range2);
  *(FunctionDeclarationSyntax **)&this->semi = this_local;
  (this->semi).info = (Info *)semi_local._0_8_;
  SyntaxList<slang::syntax::SyntaxNode>::SyntaxList(&this->items,items);
  (this->end).kind = end.kind;
  (this->end).field_0x2 = end._2_1_;
  (this->end).numFlags = (NumericTokenFlags)end.numFlags.raw;
  (this->end).rawLen = end.rawLen;
  end.info = TVar1.info;
  (this->end).info = end.info;
  this->endBlockName = endBlockName;
  pFVar2 = not_null<slang::syntax::FunctionPrototypeSyntax_*>::operator->(&this->prototype);
  (pFVar2->super_SyntaxNode).parent = (SyntaxNode *)this;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  __end2 = nonstd::span_lite::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>::begin
                     (&(this->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>
                     );
  ppSVar3 = nonstd::span_lite::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>::end
                      (&(this->items).
                        super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>);
  for (; __end2 != ppSVar3; __end2 = __end2 + 1) {
    (*__end2)->parent = (SyntaxNode *)this;
  }
  if (this->endBlockName != (NamedBlockClauseSyntax *)0x0) {
    (this->endBlockName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

FunctionDeclarationSyntax(SyntaxKind kind, const SyntaxList<AttributeInstanceSyntax>& attributes, FunctionPrototypeSyntax& prototype, Token semi, const SyntaxList<SyntaxNode>& items, Token end, NamedBlockClauseSyntax* endBlockName) :
        MemberSyntax(kind, attributes), prototype(&prototype), semi(semi), items(items), end(end), endBlockName(endBlockName) {
        this->prototype->parent = this;
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
        if (this->endBlockName) this->endBlockName->parent = this;
    }